

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O0

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
::init_multi_array_ref<long*>
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           *this,long *extents_iter)

{
  array<long,_3UL> *index_base_list;
  iterator puVar1;
  general_storage_order<3UL> *storage;
  unsigned_long uVar2;
  index iVar3;
  multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL>
  *in_RSI;
  const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  *in_RDI;
  array<unsigned_long,_3UL> *unaff_retaddr;
  array<long,_3UL> *in_stack_00000008;
  multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL>
  *in_stack_00000010;
  array<long,_3UL> *in_stack_ffffffffffffffe8;
  multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL>
  *this_00;
  const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  *storage_00;
  
  storage_00 = in_RDI;
  function_requires<boost::InputIteratorConcept<long*>>((InputIteratorConcept<long_*> *)0x0);
  this_00 = in_RSI;
  index_base_list =
       (array<long,_3UL> *)
       const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       ::num_dimensions(in_RDI);
  puVar1 = array<unsigned_long,_3UL>::begin(&in_RDI->extent_list_);
  detail::multi_array::copy_n<long*,unsigned_long,unsigned_long*>
            ((long *)in_RSI,(unsigned_long)index_base_list,puVar1);
  storage = (general_storage_order<3UL> *)array<unsigned_long,_3UL>::begin(&in_RDI->extent_list_);
  puVar1 = array<unsigned_long,_3UL>::end(&in_RDI->extent_list_);
  uVar2 = std::accumulate<unsigned_long*,unsigned_long,std::multiplies<unsigned_long>>
                    (storage,puVar1,1);
  in_RDI->num_elements_ = uVar2;
  detail::multi_array::
  multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
  ::compute_strides<boost::array<long,3ul>,boost::array<unsigned_long,3ul>>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (general_storage_order<3UL> *)storage_00);
  iVar3 = detail::multi_array::
          multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
          ::
          calculate_origin_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>,boost::array<long,3ul>>
                    (this_00,in_stack_ffffffffffffffe8,(array<unsigned_long,_3UL> *)in_RDI,storage,
                     index_base_list);
  in_RDI->origin_offset_ = iVar3;
  iVar3 = detail::multi_array::
          multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
          ::
          calculate_descending_dimension_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>>
                    (this_00,in_stack_ffffffffffffffe8,(array<unsigned_long,_3UL> *)in_RDI,storage);
  in_RDI->directional_offset_ = iVar3;
  return;
}

Assistant:

void init_multi_array_ref(InputIterator extents_iter) {
    boost::function_requires<InputIteratorConcept<InputIterator> >();

    boost::detail::multi_array::
      copy_n(extents_iter,num_dimensions(),extent_list_.begin());

    // Calculate the array size
    num_elements_ = std::accumulate(extent_list_.begin(),extent_list_.end(),
                            size_type(1),std::multiplies<size_type>());

    this->compute_strides(stride_list_,extent_list_,storage_);

    origin_offset_ =
      this->calculate_origin_offset(stride_list_,extent_list_,
                              storage_,index_base_list_);
    directional_offset_ =
      this->calculate_descending_dimension_offset(stride_list_,extent_list_,
                                            storage_);
  }